

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O2

SPEECH_DATA * new_speech_data(void)

{
  SPEECH_DATA *pSVar1;
  
  pSVar1 = (SPEECH_DATA *)operator_new(0x30);
  pSVar1->mob = (MOB_INDEX_DATA *)0x0;
  pSVar1->next = (SPEECH_DATA *)0x0;
  pSVar1->prev = (SPEECH_DATA *)0x0;
  pSVar1->name = (char *)0x0;
  pSVar1->first_line = (LINE_DATA *)0x0;
  pSVar1->current_line = (LINE_DATA *)0x0;
  return pSVar1;
}

Assistant:

SPEECH_DATA *new_speech_data(void)
{
	SPEECH_DATA *speech = new SPEECH_DATA;

	speech->next = nullptr;
	speech->prev = nullptr;
	speech->mob = nullptr;
	speech->name = nullptr;
	speech->first_line = nullptr;
	speech->current_line = nullptr;

	return speech;
}